

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralloc.c
# Opt level: O1

_Bool linear_strcat(void *parent,char **dest,char *str)

{
  uint uVar1;
  char *__s;
  size_t sVar2;
  size_t sVar3;
  char *__dest;
  uint size;
  
  sVar2 = strlen(str);
  if ((dest != (char **)0x0) && (__s = *dest, __s != (char *)0x0)) {
    sVar3 = strlen(__s);
    size = (int)sVar3 + (int)sVar2 + 1;
    __dest = (char *)linear_alloc_child(parent,size);
    uVar1 = *(uint *)(__s + -8);
    if (uVar1 != 0 && __dest != (char *)0x0) {
      if (uVar1 < size) {
        size = uVar1;
      }
      memcpy(__dest,__s,(ulong)size);
    }
    if (__dest != (char *)0x0) {
      memcpy(__dest + (sVar3 & 0xffffffff),str,sVar2 & 0xffffffff);
      __dest[(uint)((int)sVar2 + (int)sVar3)] = '\0';
      *dest = __dest;
    }
    return __dest != (char *)0x0;
  }
  __assert_fail("dest != NULL && *dest != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/util/ralloc.c"
                ,0x387,"_Bool linear_cat(void *, char **, const char *, unsigned int)");
}

Assistant:

static bool
cat(char **dest, const char *str, size_t n)
{
   char *both;
   size_t existing_length;
   assert(dest != NULL && *dest != NULL);

   existing_length = strlen(*dest);
   both = resize(*dest, existing_length + n + 1);
   if (unlikely(both == NULL))
      return false;

   memcpy(both + existing_length, str, n);
   both[existing_length + n] = '\0';

   *dest = both;
   return true;
}